

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  Recycler *pRVar1;
  Var ptr;
  JavascriptLibrary *this;
  RecyclableObject *pRVar2;
  RecyclableObject *local_88;
  uint local_7c;
  uint i;
  TrackAllocData local_68;
  WriteBarrierPtr<void> *local_40;
  Type *bArgs;
  RecyclableObject *bThis;
  RecyclableObject *bFunction;
  SnapBoundFunctionInfo *snapBoundInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  ctx = (ScriptContext *)inflator;
  inflator_local = (InflateMap *)snpObject;
  snapBoundInfo =
       (SnapBoundFunctionInfo *)
       InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  bFunction = (RecyclableObject *)
              SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapBoundFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)8>
                        ((SnapObject *)inflator_local);
  bThis = InflateMap::LookupObject
                    ((InflateMap *)ctx,((SnapBoundFunctionInfo *)bFunction)->TargetFunction);
  if ((bFunction->type).ptr == (Type *)0x0) {
    local_88 = (RecyclableObject *)0x0;
  }
  else {
    local_88 = InflateMap::LookupObject((InflateMap *)ctx,(TTD_PTR_ID)(bFunction->type).ptr);
  }
  bArgs = (Type *)local_88;
  local_40 = (WriteBarrierPtr<void> *)0x0;
  if (*(int *)&bFunction[1].super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject != 0) {
    pRVar1 = Js::ScriptContext::GetRecycler((ScriptContext *)snapBoundInfo);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
               (ulong)*(uint *)&bFunction[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSnapObjects.cpp"
               ,0x3ac);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_68);
    local_40 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                         ((Memory *)pRVar1,(Recycler *)Memory::Recycler::Alloc,0,
                          (ulong)*(uint *)&bFunction[1].super_FinalizableObject.
                                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                         );
    for (local_7c = 0;
        local_7c <
        *(uint *)&bFunction[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject; local_7c = local_7c + 1) {
      ptr = InflateMap::InflateTTDVar
                      ((InflateMap *)ctx,
                       *(TTDVar *)(&(bFunction[1].type.ptr)->typeId + (ulong)local_7c * 2));
      Memory::WriteBarrierPtr<void>::operator=(local_40 + local_7c,ptr);
    }
  }
  this = Js::ScriptContext::GetLibrary((ScriptContext *)snapBoundInfo);
  pRVar2 = Js::JavascriptLibrary::CreateBoundFunction_TTD
                     (this,bThis,bArgs,
                      *(uint32 *)
                       &bFunction[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject,local_40);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapBoundFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Bound functions are not too common and have special internal state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapBoundFunctionInfo* snapBoundInfo = SnapObjectGetAddtlInfoAs<SnapBoundFunctionInfo*, SnapObjectType::SnapBoundFunctionObject>(snpObject);

            Js::RecyclableObject* bFunction = inflator->LookupObject(snapBoundInfo->TargetFunction);
            Js::RecyclableObject* bThis = (snapBoundInfo->BoundThis != TTD_INVALID_PTR_ID) ? inflator->LookupObject(snapBoundInfo->BoundThis) : nullptr;

            Field(Js::Var)* bArgs = nullptr;
            if(snapBoundInfo->ArgCount != 0)
            {
                bArgs = RecyclerNewArray(ctx->GetRecycler(), Field(Js::Var), snapBoundInfo->ArgCount);

                for(uint i = 0; i < snapBoundInfo->ArgCount; i++)
                {
                    bArgs[i] = inflator->InflateTTDVar(snapBoundInfo->ArgArray[i]);
                }
            }

            return ctx->GetLibrary()->CreateBoundFunction_TTD(bFunction, bThis, snapBoundInfo->ArgCount, bArgs);
        }